

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

void Exa_ManPrintSolution(Exa_Man_t *p,int fCompl)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  int (*paiVar9) [32];
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  int (*local_38) [32];
  
  printf("Realization of given %d-input function using %d two-input gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar11 = p->nObjs;
  uVar10 = (ulong)(uint)p->nVars;
  if (p->nVars < iVar11) {
    local_38 = p->VarMarks[(long)iVar11 + -1] + 1;
    lVar5 = (long)iVar11;
    do {
      lVar1 = lVar5 + -1;
      iVar11 = (int)lVar1 - (int)uVar10;
      uVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar11 * 3 + 1);
      uVar3 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar11 * 3 + 2);
      uVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar11 * 3 + 3);
      if ((fCompl == 0) || (p->nObjs != (int)lVar5)) {
        pcVar7 = "%02d = 4\'b%d%d%d0(";
        uVar12 = (ulong)uVar4;
        uVar10 = (ulong)uVar3;
        uVar8 = (ulong)uVar2;
      }
      else {
        uVar12 = (ulong)(uVar4 == 0);
        uVar10 = (ulong)(uVar3 == 0);
        uVar8 = (ulong)(uVar2 == 0);
        pcVar7 = "%02d = 4\'b%d%d%d1(";
      }
      printf(pcVar7,lVar1,uVar12,uVar10,uVar8);
      lVar5 = 1;
      paiVar9 = local_38;
      do {
        iVar11 = p->nObjs;
        if (iVar11 < 1) {
LAB_005a463f:
          __assert_fail("Count == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                        ,0x218,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
        }
        uVar12 = 0;
        uVar10 = 0xffffffff;
        iVar6 = 0;
        do {
          if ((*paiVar9)[uVar12] != 0) {
            iVar11 = bmcg_sat_solver_read_cex_varvalue(p->pSat,(*paiVar9)[uVar12]);
            if (iVar11 != 0) {
              uVar10 = uVar12 & 0xffffffff;
            }
            iVar6 = iVar6 + (uint)(iVar11 != 0);
            iVar11 = p->nObjs;
          }
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)iVar11);
        if (iVar6 != 1) goto LAB_005a463f;
        iVar11 = (int)uVar10;
        if ((iVar11 < 0) || (p->nVars <= iVar11)) {
          pcVar7 = " %02d";
        }
        else {
          uVar10 = (ulong)(iVar11 + 0x61);
          pcVar7 = " %c";
        }
        printf(pcVar7,uVar10);
        paiVar9 = paiVar9 + -1;
        bVar13 = lVar5 != 0;
        lVar5 = lVar5 + -1;
      } while (bVar13);
      puts(" )");
      uVar10 = (ulong)p->nVars;
      local_38 = local_38 + -2;
      lVar5 = lVar1;
    } while ((long)uVar10 < lVar1);
  }
  return;
}

Assistant:

void Exa_ManPrintSolution( Exa_Man_t * p, int fCompl )
{
    int i, k, iVar;
    printf( "Realization of given %d-input function using %d two-input gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars; i-- )
    {
        int iVarStart = 1 + 3*(i - p->nVars);
        int Val1 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart);
        int Val2 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+1);
        int Val3 = bmcg_sat_solver_read_cex_varvalue(p->pSat, iVarStart+2);
        if ( i == p->nObjs - 1 && fCompl )
            printf( "%02d = 4\'b%d%d%d1(", i, !Val3, !Val2, !Val1 );
        else
            printf( "%02d = 4\'b%d%d%d0(", i, Val3, Val2, Val1 );
        for ( k = 1; k >= 0; k-- )
        {
            iVar = Exa_ManFindFanin( p, i, k );
            if ( iVar >= 0 && iVar < p->nVars )
                printf( " %c", 'a'+iVar );
            else
                printf( " %02d", iVar );
        }
        printf( " )\n" );
    }
}